

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

void replay_init_worker(__cilkrts_worker *w,global_state_t *g)

{
  FILE *pFVar1;
  __cilkrts_pedigree *in_RSI;
  char *in_RDI;
  char worker_file_name [512];
  char acStack_218 [16];
  replay_entry_t *in_stack_fffffffffffffdf8;
  global_state_t *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  char *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  rsize_t in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  if (*(int *)&in_RSI[0x49].parent != 0) {
    if (*(int *)&in_RSI[0x49].parent == 2) {
      load_recorded_log(w);
      scan_for_matching_steals(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    if (*(int *)&in_RSI[0x49].parent == 1) {
      snprintf_s_si(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                    in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      pFVar1 = fopen(acStack_218,"w+");
      *(FILE **)(*(long *)(in_RDI + 0x38) + 0x1b0) = pFVar1;
      if (*(long *)(*(long *)(in_RDI + 0x38) + 0x1b0) == 0) {
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/record-replay.cpp"
                      ,0x2d2,"NULL != w->l->record_replay_fptr");
      }
      if (*(int *)(in_RDI + 0x28) == 0) {
        write_to_replay_log((__cilkrts_worker *)worker_file_name._0_8_,in_RDI,in_RSI,
                            in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
      }
    }
  }
  return;
}

Assistant:

void replay_init_worker(__cilkrts_worker* w, global_state_t *g)
{
    char worker_file_name[512];

    // If we're not recording or replaying a log, we're done.  All of the
    // fields in the global_state_t or local_state_t are already initialized
    // to default values.
    if (RECORD_REPLAY_NONE == g->record_or_replay)
        return;

    // If we're replaying a log, read worker's log and construct the
    // in-memory log
    if (REPLAY_LOG == g->record_or_replay)
    {
        // This function will also initialize and fill the worker's
        // replay list
        load_recorded_log(w);

        // Scan for orphans with no matching steal.  Mark them so they'll be
        // skipped as we advance through the log.
        scan_for_matching_steals(g, w->l->replay_list_root);

        // If we're recording the logs while replaying, create the log files.
        // This will only be used for debugging.  Create the logs in the
        // current directory.  It should be as good a place as any...
#if RECORD_ON_REPLAY
        cilk_snprintf_i(worker_file_name, sizeof(worker_file_name),
                        "replay_log_%d.cilklog",  w->self);
        w->l->record_replay_fptr = fopen(worker_file_name, "w+");
        CILK_ASSERT(NULL != w->l->record_replay_fptr);

        // Record the number of workers, file version in Worker 0's file
        if (w->self == 0) {
            write_to_replay_log (w, PED_TYPE_STR_WORKERS, NULL, g->P, PED_VERSION);
        }
#endif // RECORD_ON_REPLAY
    }

    // If we're recording, create the log files
    if (RECORD_LOG == g->record_or_replay)
    {
        cilk_snprintf_si(worker_file_name, sizeof(worker_file_name),
                         "%s%d.cilklog", g->record_replay_file_name, w->self);
        w->l->record_replay_fptr = fopen(worker_file_name, "w+");
        CILK_ASSERT(NULL != w->l->record_replay_fptr);

        // Record the number of workers, file version in Worker 0's file
        if (w->self == 0) {
            write_to_replay_log(w, PED_TYPE_STR_WORKERS, NULL, g->P, PED_VERSION);
        }
    }
}